

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *data,bool update,int offset,int size)

{
  pointer puVar1;
  pointer puVar2;
  pointer pGVar3;
  size_t __n;
  int iVar4;
  invalid_argument *piVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  pointer pGVar9;
  ulong uVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> intData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c8,
             (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&bStack_128);
  puVar1 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)puVar1 - (long)puVar2 >> 2;
  if (puVar1 != puVar2) {
    uVar8 = 0;
    do {
      local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = puVar2[uVar8];
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < uVar10);
  }
  pGVar9 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar3 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pGVar9 != pGVar3) {
    __n = name->_M_string_length;
    do {
      if ((pGVar9->name)._M_string_length == __n) {
        if (__n == 0) {
LAB_002147fe:
          if (pGVar9->type == UInt) {
            if (!update) {
              pGVar9->dataSize = uVar10;
            }
            if (local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            return;
          }
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_b0,"Tried to set GLShaderAttribute named ",name);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
          psVar7 = (size_type *)(plVar6 + 2);
          local_108._M_dataplus._M_p = (pointer)*plVar6;
          if ((size_type *)local_108._M_dataplus._M_p == psVar7) {
            local_108.field_2._M_allocated_capacity = *psVar7;
            local_108.field_2._8_8_ = plVar6[3];
            local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          }
          else {
            local_108.field_2._M_allocated_capacity = *psVar7;
          }
          local_108._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::to_string(&local_70,pGVar9->type);
          std::operator+(&local_50,&local_108,&local_70);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          psVar7 = (size_type *)(plVar6 + 2);
          local_e8._M_dataplus._M_p = (pointer)*plVar6;
          if ((size_type *)local_e8._M_dataplus._M_p == psVar7) {
            local_e8.field_2._M_allocated_capacity = *psVar7;
            local_e8.field_2._8_8_ = plVar6[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar7;
          }
          local_e8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::to_string(&local_90,6);
          std::operator+(&bStack_128,&local_e8,&local_90);
          std::invalid_argument::invalid_argument(piVar5,(string *)&bStack_128);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        iVar4 = bcmp((pGVar9->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
        if (iVar4 == 0) goto LAB_002147fe;
      }
      pGVar9 = pGVar9 + 1;
    } while (pGVar9 != pGVar3);
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_128,"No attribute with name ",name);
  std::invalid_argument::invalid_argument(piVar5,(string *)&bStack_128);
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, const std::vector<uint32_t>& data, bool update, int offset,
                                   int size) {
  // FIXME I've seen strange bugs when using int's in shaders. Need to figure
  // out it it's my shaders or something wrong with this function

  // Convert data to GL_UINT (probably does nothing)
  std::vector<unsigned int> intData(data.size());
  for (unsigned int i = 0; i < data.size(); i++) {
    intData[i] = static_cast<unsigned int>(data[i]);
  }

  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {
      if (a.type == DataType::UInt) {
        if (update) {
          // TODO: Allow modifications to non-contiguous memory
          offset *= sizeof(unsigned int);
          if (size == -1)
            size = a.dataSize * sizeof(unsigned int);
          else
            size *= sizeof(unsigned int);

        } else {
          a.dataSize = data.size();
        }
      } else {
        throw std::invalid_argument("Tried to set GLShaderAttribute named " + name +
                                    " with wrong type. Actual type: " + std::to_string(static_cast<int>(a.type)) +
                                    "  Attempted type: " + std::to_string(static_cast<int>(DataType::UInt)));
      }
      return;
    }
  }

  throw std::invalid_argument("No attribute with name " + name);
}